

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph.h
# Opt level: O1

void duckdb_je_hpdata_age_heap_insert(hpdata_age_heap_t *ph,hpdata_t *phn)

{
  hpdata_t *phVar1;
  hpdata_t *phVar2;
  hpdata_t *phVar3;
  hpdata_t *phVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  hpdata_t *phVar8;
  bool bVar9;
  
  (phn->field_13).age_link.link.prev = (void *)0x0;
  (phn->field_13).age_link.link.next = (void *)0x0;
  (phn->field_13).age_link.link.lchild = (void *)0x0;
  phVar1 = (hpdata_t *)(ph->ph).root;
  if (phVar1 == (hpdata_t *)0x0) {
    (ph->ph).root = phn;
    return;
  }
  if (phn->h_age < phVar1->h_age) {
    (phn->field_13).age_link.link.lchild = phVar1;
    (phVar1->field_13).ql_link_empty.qre_next = phn;
    (ph->ph).root = phn;
    (ph->ph).auxcount = 0;
    return;
  }
  (phn->field_13).age_link.link.next = (phVar1->field_13).age_link.link.next;
  phVar2 = (phVar1->field_13).ql_link_empty.qre_prev;
  if (phVar2 != (hpdata_t *)0x0) {
    (phVar2->field_13).ql_link_empty.qre_next = phn;
  }
  (phn->field_13).ql_link_empty.qre_next = phVar1;
  (phVar1->field_13).ql_link_empty.qre_prev = phn;
  uVar6 = (ph->ph).auxcount + 1;
  (ph->ph).auxcount = uVar6;
  lVar5 = 0;
  if (uVar6 != 0) {
    for (; (uVar6 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
    }
  }
  if (lVar5 != 0) {
    uVar7 = 1;
    do {
      phVar2 = (phVar1->field_13).ql_link_empty.qre_prev;
      bVar9 = true;
      if ((phVar2 != (hpdata_t *)0x0) &&
         (phVar8 = (phVar2->field_13).ql_link_empty.qre_prev, phVar8 != (hpdata_t *)0x0)) {
        phVar3 = (phVar8->field_13).ql_link_empty.qre_prev;
        (phVar2->field_13).age_link.link.prev = (void *)0x0;
        (phVar2->field_13).age_link.link.next = (void *)0x0;
        (phVar8->field_13).age_link.link.prev = (void *)0x0;
        (phVar8->field_13).age_link.link.next = (void *)0x0;
        if (phVar2->h_age < phVar8->h_age) {
          (phVar8->field_13).ql_link_empty.qre_next = phVar2;
          phVar4 = (hpdata_t *)(phVar2->field_13).age_link.link.lchild;
          (phVar8->field_13).ql_link_empty.qre_prev = phVar4;
          if (phVar4 != (hpdata_t *)0x0) {
            (phVar4->field_13).ql_link_empty.qre_next = phVar8;
          }
          (phVar2->field_13).age_link.link.lchild = phVar8;
          phVar8 = phVar2;
        }
        else {
          (phVar2->field_13).ql_link_empty.qre_next = phVar8;
          phVar4 = (hpdata_t *)(phVar8->field_13).age_link.link.lchild;
          (phVar2->field_13).ql_link_empty.qre_prev = phVar4;
          if (phVar4 != (hpdata_t *)0x0) {
            (phVar4->field_13).ql_link_empty.qre_next = phVar2;
          }
          (phVar8->field_13).age_link.link.lchild = phVar2;
        }
        (phVar8->field_13).ql_link_empty.qre_prev = phVar3;
        bVar9 = phVar3 == (hpdata_t *)0x0;
        if (!bVar9) {
          (phVar3->field_13).ql_link_empty.qre_next = phVar8;
        }
        (phVar1->field_13).ql_link_empty.qre_prev = phVar8;
        (phVar8->field_13).ql_link_empty.qre_next = phVar1;
      }
    } while ((!bVar9) && (bVar9 = uVar7 < (uint)lVar5, uVar7 = uVar7 + 1, bVar9));
  }
  return;
}

Assistant:

JEMALLOC_ALWAYS_INLINE void
phn_link_init(void *phn, size_t offset) {
	phn_link_get(phn, offset)->prev = NULL;
	phn_link_get(phn, offset)->next = NULL;
	phn_link_get(phn, offset)->lchild = NULL;
}